

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O1

bool __thiscall
kj::anon_unknown_35::InMemoryDirectory::tryTransfer
          (InMemoryDirectory *this,PathPtr toPath,WriteMode toMode,Directory *fromDirectory,
          PathPtr fromPath,TransferMode mode)

{
  size_t sVar1;
  PathPtr fromPath_00;
  Impl *pIVar2;
  undefined1 uVar3;
  bool bVar4;
  Maybe<kj::(anonymous_namespace)::InMemoryDirectory::EntryImpl_&> entry;
  long lVar5;
  char *pcVar6;
  undefined8 extraout_RDX;
  StringPtr name;
  StringPtr name_00;
  bool needRollback;
  Locked<kj::(anonymous_namespace)::InMemoryDirectory::Impl> lock;
  Fault f_1;
  Fault f;
  undefined1 local_c1;
  TransferMode local_c0;
  Type local_bc;
  Mutex *local_b8;
  Impl *local_b0;
  String *local_a8;
  size_t local_a0;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 local_98;
  undefined1 local_90 [8];
  undefined1 *local_88;
  long *local_80;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 local_78;
  undefined1 local_70;
  anon_union_8_1_a8c68091_for_NullableValue<kj::Absolute<kj::Quantity<long,_kj::_::NanosecondLabel>,_kj::_::DateLabel>_>_2
  local_68;
  Maybe<unsigned_long> local_50;
  Maybe<kj::Absolute<kj::Quantity<long,_kj::_::NanosecondLabel>,_kj::_::DateLabel>_> local_40;
  
  local_a0 = toPath.parts.size_;
  local_a8 = toPath.parts.ptr;
  local_c0 = mode;
  if (local_a0 == 1) {
    (*(fromDirectory->super_ReadableDirectory).super_FsNode._vptr_FsNode[9])
              (&local_88,fromDirectory,fromPath.parts.ptr,fromPath.parts.size_);
    if ((char)local_88 == '\x01') {
      local_bc = (Type)local_80;
      local_98 = local_78;
      kj::_::Mutex::lock(&(this->impl).mutex,EXCLUSIVE);
      local_b0 = &(this->impl).value;
      sVar1 = (local_a8->content).size_;
      if (sVar1 == 0) {
        pcVar6 = "";
      }
      else {
        pcVar6 = (local_a8->content).ptr;
      }
      name_00.content.size_ = sVar1 + (sVar1 == 0);
      name_00.content.ptr = pcVar6;
      local_b8 = &(this->impl).mutex;
      entry = Impl::openEntry(local_b0,name_00,toMode);
      if (entry.ptr == (EntryImpl *)0x0) {
        bVar4 = false;
      }
      else {
        local_c1 = ((entry.ptr)->node).tag == 0;
        local_88 = &local_c1;
        local_80 = (long *)&local_b8;
        local_78.value = (unsigned_long)&local_a8;
        local_70 = 0;
        local_40.ptr.isSet = true;
        local_40.ptr.field_1 = local_68;
        local_50.ptr.isSet = true;
        local_50.ptr.field_1 = local_98;
        fromPath_00.parts.ptr._4_4_ = fromPath.parts.ptr._4_4_;
        fromPath_00.parts.ptr._0_4_ = fromPath.parts.ptr._0_4_;
        fromPath_00.parts.size_._0_4_ = (undefined4)fromPath.parts.size_;
        fromPath_00.parts.size_._4_4_ = fromPath.parts.size_._4_4_;
        bVar4 = Impl::tryTransferChild
                          (local_b0,entry.ptr,local_bc,&local_40,&local_50,fromDirectory,fromPath_00
                           ,local_c0);
        pIVar2 = local_b0;
        if (bVar4) {
          lVar5 = (*(code *)**(undefined8 **)local_b0->clock)();
          (pIVar2->lastModified).value.value = lVar5;
          local_c1 = 0;
        }
        else {
          kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[51],kj::PathPtr&>
                    ((Fault *)local_90,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem.c++"
                     ,0x506,FAILED,(char *)0x0,
                     "\"InMemoryDirectory can\'t link an inode of this type\", fromPath",
                     (char (*) [51])"InMemoryDirectory can\'t link an inode of this type",&fromPath)
          ;
          kj::_::Debug::Fault::~Fault((Fault *)local_90);
        }
        kj::_::
        Deferred<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem.c++:1278:11)>
        ::~Deferred((Deferred<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_filesystem_c__:1278:11)>
                     *)&local_88);
      }
      if (local_b8 == (Mutex *)0x0) {
        return bVar4;
      }
      kj::_::Mutex::unlock(local_b8,EXCLUSIVE);
      return bVar4;
    }
  }
  else {
    if (local_a0 != 0) {
      sVar1 = (local_a8->content).size_;
      if (sVar1 == 0) {
        pcVar6 = "";
      }
      else {
        pcVar6 = (local_a8->content).ptr;
      }
      name.content.size_ = (size_t)pcVar6;
      name.content.ptr = (char *)this;
      tryGetParent((InMemoryDirectory *)&local_88,name,(int)sVar1 + (uint)(sVar1 == 0));
      if (local_80 != (long *)0x0) {
        uVar3 = (**(code **)(*local_80 + 0xa0))
                          (local_80,local_a8 + 1,local_a0 - 1,toMode,fromDirectory,local_c0,
                           fromPath.parts.ptr._0_4_,(undefined4)fromPath.parts.size_);
        (*(code *)**(undefined8 **)local_88)
                  (local_88,(long)local_80 + *(long *)(*local_80 + -0x10),extraout_RDX);
        return (bool)uVar3;
      }
      return false;
    }
    if ((toMode & CREATE) == 0) {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[19]>
                ((Fault *)&local_88,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem.c++"
                 ,0x4f4,FAILED,(char *)0x0,"\"can\'t replace self\"",
                 (char (*) [19])"can\'t replace self");
      kj::_::Debug::Fault::~Fault((Fault *)&local_88);
      return false;
    }
  }
  return false;
}

Assistant:

bool tryTransfer(PathPtr toPath, WriteMode toMode,
                   const Directory& fromDirectory, PathPtr fromPath,
                   TransferMode mode) const override {
    if (toPath.size() == 0) {
      if (has(toMode, WriteMode::CREATE)) {
        return false;
      } else {
        KJ_FAIL_REQUIRE("can't replace self") { return false; }
      }
    } else if (toPath.size() == 1) {
      // tryTransferChild() needs to at least know the node type, so do an lstat.
      KJ_IF_MAYBE(meta, fromDirectory.tryLstat(fromPath)) {
        auto lock = impl.lockExclusive();
        KJ_IF_MAYBE(entry, lock->openEntry(toPath[0], toMode)) {
          // Make sure if we just cerated a new entry, and we don't successfully transfer to it, we
          // remove the entry before returning.
          bool needRollback = entry->node == nullptr;
          KJ_DEFER(if (needRollback) { lock->entries.erase(toPath[0]); });

          if (lock->tryTransferChild(*entry, meta->type, meta->lastModified, meta->size,
                                     fromDirectory, fromPath, mode)) {
            lock->modified();
            needRollback = false;
            return true;
          } else {
            KJ_FAIL_REQUIRE("InMemoryDirectory can't link an inode of this type", fromPath) {
              return false;
            }
          }
        } else {
          return false;
        }
      } else {
        return false;
      }
    } else {
      // TODO(someday): Ideally we wouldn't create parent directories if fromPath doesn't exist.
      //   This requires a different approach to the code here, though.
      KJ_IF_MAYBE(child, tryGetParent(toPath[0], toMode)) {
        return child->get()->tryTransfer(
            toPath.slice(1, toPath.size()), toMode, fromDirectory, fromPath, mode);
      } else {
        return false;
      }
    }
  }